

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (d == s || (flags & 1) != 0) {
    return 1;
  }
  uVar4 = 0;
  while( true ) {
    do {
      d = cts->tab + (ushort)d->info;
      uVar1 = d->info;
      uVar7 = uVar1 >> 0x1c;
    } while (uVar7 == 5);
    if (uVar7 != 8) break;
    if ((uVar1 & 0xff0000) == 0x10000) {
      uVar4 = uVar4 | d->size;
    }
  }
  uVar6 = 0;
  if ((s->info & 0xf0000000) != 0x10000000) {
    uVar6 = 0;
    while( true ) {
      do {
        s = cts->tab + (ushort)s->info;
        uVar2 = s->info;
      } while (uVar2 >> 0x1c == 5);
      if (uVar2 >> 0x1c != 8) break;
      if ((uVar2 & 0xff0000) == 0x10000) {
        uVar6 = uVar6 | s->size;
      }
    }
    uVar6 = uVar2 & 0x3000000 | uVar6;
  }
  uVar4 = uVar1 & 0x3000000 | uVar4;
  if ((flags & 4) == 0) {
    if ((flags & 8) != 0) goto LAB_0014aa49;
    iVar5 = 0;
    bVar3 = false;
    if ((uVar6 & ~uVar4) != 0) goto LAB_0014aaaf;
    iVar5 = 1;
    if (((uVar1 & 0xf0000000) != 0x40000000) && ((s->info & 0xf0000000) != 0x40000000))
    goto LAB_0014aa49;
LAB_0014aa9a:
    bVar3 = false;
  }
  else {
    iVar5 = 0;
    bVar3 = false;
    if (uVar4 != uVar6) goto LAB_0014aaaf;
LAB_0014aa49:
    iVar5 = 0;
    bVar3 = false;
    if ((uVar7 != s->info >> 0x1c) || (iVar5 = 0, d->size != s->size)) goto LAB_0014aaaf;
    if (uVar1 < 0x10000000) {
      iVar5 = 0;
      if (((s->info ^ uVar1) & 0xc000000) != 0) goto LAB_0014aaaf;
    }
    else {
      if ((uVar1 & 0xe0000000) == 0x20000000) {
        iVar5 = lj_cconv_compatptr(cts,d,s,flags | 4);
        goto LAB_0014aa9a;
      }
      if ((uVar7 == 1) && (iVar5 = 0, d != s)) goto LAB_0014aaaf;
    }
    iVar5 = 0;
    bVar3 = true;
  }
LAB_0014aaaf:
  if (bVar3) {
    return 1;
  }
  return iVar5;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}